

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_multiple_positional_array_argument2(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  undefined8 *puVar6;
  char **ppcVar7;
  ulong uVar8;
  byte bVar9;
  cargo_t cargo;
  size_t m_count;
  size_t j_count;
  float m [3];
  int j [3];
  int i;
  char *args [9];
  
  bVar9 = 0;
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 != 0) {
    return "Failed to init cargo";
  }
  j_count = 0;
  m_count = 0;
  puVar6 = &DAT_00131fe0;
  ppcVar7 = args;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *ppcVar7 = (char *)*puVar6;
    puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
    ppcVar7 = ppcVar7 + (ulong)bVar9 * -2 + 1;
  }
  iVar1 = cargo_add_option(cargo,0,"alpha","The alpha",".[i]#",j,&j_count,3);
  iVar2 = cargo_add_option(cargo,0,"mad","Mutual Assured Destruction",".[f]#",m,&m_count,3);
  iVar3 = cargo_add_option(cargo,0,"--beta -b","The beta","i",&i);
  if (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0)) {
    iVar1 = cargo_parse(cargo,0,1,9,args);
    if (j_count != 0) {
      uVar8 = 0;
      do {
        printf("alpha = %d\n",(ulong)(uint)j[uVar8]);
        uVar8 = uVar8 + 1;
      } while (uVar8 < j_count);
    }
    if (m_count != 0) {
      uVar8 = 0;
      do {
        printf("mad = %f\n",(double)m[uVar8]);
        uVar8 = uVar8 + 1;
      } while (uVar8 < m_count);
    }
    if (iVar1 == 0) {
      puts("Check that \"j\" has 3 elements");
      if (j_count == 3) {
        lVar4 = 0;
        do {
          if (*(int *)((long)j + lVar4) != *(int *)((long)&DAT_0012318c + lVar4)) goto LAB_00115dd8;
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0xc);
        puts("Check that \"m\" has 3 elements");
        if (m_count == 3) {
          pcVar5 = (char *)0x0;
          lVar4 = 0;
          do {
            if ((*(float *)((long)m + lVar4) != *(float *)((long)&DAT_00123180 + lVar4)) ||
               (NAN(*(float *)((long)m + lVar4)) || NAN(*(float *)((long)&DAT_00123180 + lVar4))))
            goto LAB_00115dd8;
            lVar4 = lVar4 + 4;
          } while (lVar4 != 0xc);
        }
        else {
          pcVar5 = "m array count m_count is not expected 3";
        }
      }
      else {
        pcVar5 = "j array count j_count is not expected 3";
      }
    }
    else {
      pcVar5 = "Failed to parse positional argument";
    }
  }
  else {
    pcVar5 = "Failed to add options";
  }
LAB_00115de4:
  cargo_destroy(&cargo);
  return pcVar5;
LAB_00115dd8:
  pcVar5 = "Array contains unexpected value";
  goto LAB_00115de4;
}

Assistant:

_TEST_START(TEST_multiple_positional_array_argument2)
{
    // Shuffle the order of arguments
    size_t k;
    int i;
    int j[3];
    int j_expect[] = { 456, 789, 101112 };
    size_t j_count = 0;
    float m[3];
    float m_expect[] = { 4.3f, 2.3f, 50.34f };
    size_t m_count = 0;
    char *args[] =
    {
        "program",
        "456", "789", "101112",
        "--beta", "123",
        "4.3", "2.3", "50.34"
    };

    ret |= cargo_add_option(cargo, 0, "alpha", "The alpha", ".[i]#",
                            &j, &j_count, 3);
    ret |= cargo_add_option(cargo, 0, "mad", "Mutual Assured Destruction", ".[f]#",
                            &m, &m_count, 3);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &i);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);

    for (k = 0; k < j_count; k++)
    {
        printf("alpha = %d\n", j[k]);
    }

    for (k = 0; k < m_count; k++)
    {
        printf("mad = %f\n", m[k]);
    }

    cargo_assert(ret == 0, "Failed to parse positional argument");
    cargo_assert_array(j_count, 3, j, j_expect);
    cargo_assert(m, "m is NULL");
    cargo_assert_array(m_count, 3, m, m_expect);

    _TEST_CLEANUP();
}